

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

JumpCommand * __thiscall AssemblyCode::JumpCommand::ToString_abi_cxx11_(JumpCommand *this)

{
  string local_38 [40];
  JumpCommand *this_local;
  
  this_local = this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"jmp ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string AssemblyCode::JumpCommand::ToString( ) const {
    return "jmp " + label + "\n";
}